

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
getTypeHierarchy(UA_NodeStore *ns,UA_Node *rootRef,UA_Boolean inverse,UA_NodeId **typeHierarchy,
                size_t *typeHierarchySize)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  UA_NodeId *dst;
  UA_NodeId *pUVar3;
  UA_Node *pUVar4;
  undefined8 uVar5;
  UA_ReferenceNode *pUVar6;
  ulong uVar7;
  UA_Byte *pUVar8;
  undefined1 local_a8 [8];
  UA_NodeId hasSubtypeNodeId;
  UA_Byte *local_58;
  UA_Byte *local_40;
  
  dst = (UA_NodeId *)malloc(0x1e0);
  if (dst == (UA_NodeId *)0x0) {
    UVar2 = 0x80030000;
  }
  else {
    UVar2 = UA_NodeId_copy(&rootRef->nodeId,dst);
    if (UVar2 == 0) {
      local_a8._0_2_ = 0;
      stack0xffffffffffffff5c = 0x2d00000000;
      local_58 = (UA_Byte *)0x14;
      uVar5 = (UA_Byte *)0x0;
      local_40 = (UA_Byte *)0x0;
      pUVar4 = rootRef;
      do {
        hasSubtypeNodeId.identifier.string.data = (UA_Byte *)uVar5;
        for (uVar7 = 0; uVar7 < pUVar4->referencesSize; uVar7 = uVar7 + 1) {
          pUVar6 = pUVar4->references;
          if ((pUVar6[uVar7].isInverse == inverse) &&
             (UVar1 = UA_NodeId_equal((UA_NodeId *)local_a8,&pUVar6[uVar7].referenceTypeId), UVar1))
          {
            pUVar8 = (UA_Byte *)0xffffffffffffffff;
            pUVar3 = dst;
            do {
              pUVar8 = pUVar8 + 1;
              if (local_40 < pUVar8) {
                pUVar8 = local_40 + 1;
                if (local_58 <= pUVar8) {
                  pUVar3 = (UA_NodeId *)realloc(dst,(long)local_58 * 0x30);
                  if (pUVar3 == (UA_NodeId *)0x0) {
                    UVar2 = 0x80030000;
                    pUVar8 = local_40;
                    goto LAB_00119148;
                  }
                  local_58 = (UA_Byte *)((long)local_58 * 2);
                  pUVar6 = pUVar4->references;
                  dst = pUVar3;
                }
                UVar2 = UA_NodeId_copy(&pUVar6[uVar7].targetId.nodeId,dst + (long)pUVar8);
                local_40 = pUVar8;
                if (UVar2 != 0) {
LAB_00119148:
                  UA_Array_delete(dst,(size_t)pUVar8,UA_TYPES + 0x10);
                  return UVar2;
                }
                break;
              }
              UVar1 = UA_NodeId_equal(&pUVar6[uVar7].targetId.nodeId,pUVar3);
              pUVar3 = pUVar3 + 1;
            } while (!UVar1);
          }
        }
        pUVar3 = dst + (long)hasSubtypeNodeId.identifier.guid.data4;
        uVar5 = hasSubtypeNodeId.identifier.string.data;
        do {
          pUVar3 = pUVar3 + 1;
          uVar5 = uVar5 + 1;
          if (local_40 < (ulong)uVar5) {
            *typeHierarchy = dst;
            *typeHierarchySize = (size_t)(local_40 + 1);
            return 0;
          }
          pUVar4 = UA_NodeStore_get(ns,pUVar3);
        } while ((pUVar4 == (UA_Node *)0x0) || (pUVar4->nodeClass != rootRef->nodeClass));
      } while( true );
    }
    free(dst);
  }
  return UVar2;
}

Assistant:

UA_StatusCode
getTypeHierarchy(UA_NodeStore *ns, const UA_Node *rootRef, UA_Boolean inverse,
                 UA_NodeId **typeHierarchy, size_t *typeHierarchySize) {
    size_t results_size = 20; // probably too big, but saves mallocs
    UA_NodeId *results = UA_malloc(sizeof(UA_NodeId) * results_size);
    if(!results)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    UA_StatusCode retval = UA_NodeId_copy(&rootRef->nodeId, &results[0]);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_free(results);
        return retval;
    }

    const UA_Node *node = rootRef;
    size_t idx = 0; /* Current index (contains NodeId of node) */
    size_t last = 0; /* Index of the last element in the array */
    const UA_NodeId hasSubtypeNodeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    while(true) {
        for(size_t i = 0; i < node->referencesSize; ++i) {
            /* is the reference relevant? */
            if(node->references[i].isInverse != inverse ||
               !UA_NodeId_equal(&hasSubtypeNodeId, &node->references[i].referenceTypeId))
                continue;

            /* is the target already considered? (multi-inheritance) */
            UA_Boolean duplicate = false;
            for(size_t j = 0; j <= last; ++j) {
                if(UA_NodeId_equal(&node->references[i].targetId.nodeId, &results[j])) {
                    duplicate = true;
                    break;
                }
            }
            if(duplicate)
                continue;

            /* increase array length if necessary */
            if(last + 1 >= results_size) {
                                UA_NodeId *new_results =
                                    UA_realloc(results, sizeof(UA_NodeId) * results_size * 2);
                                if(!new_results) {
                                    retval = UA_STATUSCODE_BADOUTOFMEMORY;
                                    break;
                                }
                                results = new_results;
                                results_size *= 2;
            }

            /* copy new nodeid to the end of the list */
            retval = UA_NodeId_copy(&node->references[i].targetId.nodeId, &results[++last]);
            if(retval != UA_STATUSCODE_GOOD)
                break;
        }

        /* Get the next node */
    next:
        ++idx;
        if(idx > last || retval != UA_STATUSCODE_GOOD)
            break;
        node = UA_NodeStore_get(ns, &results[idx]);
        if(!node || node->nodeClass != rootRef->nodeClass)
            goto next;
    }

    if(retval != UA_STATUSCODE_GOOD) {
        UA_Array_delete(results, last, &UA_TYPES[UA_TYPES_NODEID]);
        return retval;
    }

    *typeHierarchy = results;
    *typeHierarchySize = last + 1;
    return UA_STATUSCODE_GOOD;
}